

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WjTestLib_Memory.c
# Opt level: O2

void WjTestLib_Free(void *Memory)

{
  char *__ptr;
  size_t sStack_10;
  
  if (Memory == (void *)0x0) {
    __ptr = "***** MEMORY ERROR (WjTestLib_Free) *****\n";
    sStack_10 = 0x2a;
  }
  else {
    free(Memory);
    gTotalNumFrees = gTotalNumFrees + 1;
    if (gTotalNumFrees <= gTotalNumAllocations) {
      return;
    }
    __ptr = "***** MEMORY ERROR (MORE FREES THAN ALLOCS) *****\n";
    sStack_10 = 0x32;
  }
  fwrite(__ptr,sStack_10,1,_stderr);
  return;
}

Assistant:

void
    WjTestLib_Free
    (
        void*       Memory
    )
{
    if( NULL != Memory )
    {
        free( Memory );
        gTotalNumFrees += 1;
        if( gTotalNumFrees > gTotalNumAllocations )
        {
            fprintf( stderr, "***** MEMORY ERROR (MORE FREES THAN ALLOCS) *****\n" );
        }
    }
    else
    {
        fprintf( stderr, "***** MEMORY ERROR (WjTestLib_Free) *****\n" );
    }
}